

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainWithIndex
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,Instruction *var,
          uint32_t index,Instruction *insert_before)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t ty_id;
  StorageClass storage_class;
  uint32_t res_id;
  IRContext *pIVar1;
  ConstantManager *this_00;
  Instruction *this_01;
  pointer inst_00;
  DefUseManager *this_02;
  Operand *local_158;
  Instruction *inst;
  iterator local_140;
  undefined8 local_138;
  SmallVector<unsigned_int,_2UL> local_130;
  uint32_t local_104;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  Operand local_c8;
  Operand OStack_98;
  iterator local_68;
  _func_int **local_60;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_58;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_access_chain;
  uint32_t index_id;
  uint32_t ptr_type_id;
  Instruction *insert_before_local;
  uint32_t index_local;
  Instruction *var_local;
  uint32_t component_type_id_local;
  InterfaceVariableScalarReplacement *this_local;
  
  storage_class = anon_unknown_0::GetStorageClass(var);
  new_access_chain._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       GetPointerType(this,component_type_id,storage_class);
  pIVar1 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_constant_mgr(pIVar1);
  new_access_chain._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._0_4_ =
       analysis::ConstantManager::GetUIntConstId(this_00,index);
  this_01 = (Instruction *)::operator_new(0x70);
  pIVar1 = Pass::context(&this->super_Pass);
  ty_id = new_access_chain._M_t.
          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  res_id = Pass::TakeNextId(&this->super_Pass);
  local_104 = opt::Instruction::result_id(var);
  local_100 = &local_104;
  local_f8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_100;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list_00);
  Operand::Operand(&local_c8,SPV_OPERAND_TYPE_ID,&local_f0);
  inst._4_4_ = (uint32_t)
               new_access_chain._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_140 = (iterator)((long)&inst + 4);
  local_138 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_140;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list);
  Operand::Operand(&OStack_98,SPV_OPERAND_TYPE_ID,&local_130);
  local_68 = &local_c8;
  local_60 = (_func_int **)0x2;
  std::allocator<spvtools::opt::Operand>::allocator
            ((allocator<spvtools::opt::Operand> *)((long)&inst + 3));
  __l._M_len = (size_type)local_60;
  __l._M_array = local_68;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_58,__l,(allocator_type *)((long)&inst + 3));
  opt::Instruction::Instruction(this_01,pIVar1,OpAccessChain,ty_id,res_id,&local_58);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_40,this_01);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_58);
  std::allocator<spvtools::opt::Operand>::~allocator
            ((allocator<spvtools::opt::Operand> *)((long)&inst + 3));
  local_158 = (Operand *)&local_68;
  do {
    local_158 = local_158 + -1;
    Operand::~Operand(local_158);
  } while (local_158 != &local_c8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
  inst_00 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::get(&local_40);
  pIVar1 = Pass::context(&this->super_Pass);
  this_02 = IRContext::get_def_use_mgr(pIVar1);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,inst_00);
  opt::Instruction::InsertBefore(insert_before,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  return inst_00;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainWithIndex(
    uint32_t component_type_id, Instruction* var, uint32_t index,
    Instruction* insert_before) {
  uint32_t ptr_type_id =
      GetPointerType(component_type_id, GetStorageClass(var));
  uint32_t index_id = context()->get_constant_mgr()->GetUIntConstId(index);
  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}},
          {SPV_OPERAND_TYPE_ID, {index_id}},
      }));
  Instruction* inst = new_access_chain.get();
  context()->get_def_use_mgr()->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}